

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_wbuf.c
# Opt level: O0

void lj_wbuf_init(lj_wbuf *buf,lj_wbuf_writer writer,void *ctx,uint8_t *mem,size_t size)

{
  size_t size_local;
  uint8_t *mem_local;
  void *ctx_local;
  lj_wbuf_writer writer_local;
  lj_wbuf *buf_local;
  
  buf->ctx = ctx;
  buf->writer = writer;
  buf->buf = mem;
  buf->pos = mem;
  buf->size = size;
  buf->flags = '\0';
  buf->saved_errno = 0;
  return;
}

Assistant:

void lj_wbuf_init(struct lj_wbuf *buf, lj_wbuf_writer writer,
		  void *ctx, uint8_t *mem, size_t size)
{
  buf->ctx = ctx;
  buf->writer = writer;
  buf->buf = mem;
  buf->pos = mem;
  buf->size = size;
  buf->flags = 0;
  buf->saved_errno = 0;
}